

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRectangleHollowProfileDef::~IfcRectangleHollowProfileDef
          (IfcRectangleHollowProfileDef *this)

{
  IfcProfileDef::~IfcProfileDef((IfcProfileDef *)this,&PTR_construction_vtable_24__007abd10);
  return;
}

Assistant:

IfcRectangleHollowProfileDef() : Object("IfcRectangleHollowProfileDef") {}